

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * __thiscall
fmt::v10::detail::
format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
::on_format_specs(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                  *this,int id,char *begin,char *param_3)

{
  char *pcVar1;
  
  basic_format_parse_context<char>::advance_to((basic_format_parse_context<char> *)(this + 8),begin)
  ;
  if ((uint)id < 2) {
    pcVar1 = (char *)(**(code **)(this + (ulong)(uint)id * 8 + 0x28))
                               ((basic_format_parse_context<char> *)(this + 8));
    return pcVar1;
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR auto on_format_specs(int id, const Char* begin, const Char*)
      -> const Char* {
    context_.advance_to(begin);
    // id >= 0 check is a workaround for gcc 10 bug (#2065).
    return id >= 0 && id < num_args ? parse_funcs_[id](context_) : begin;
  }